

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adventurer.cpp
# Opt level: O0

void __thiscall despot::Adventurer::PrintPOMDPX(Adventurer *this)

{
  int iVar1;
  ostream *poVar2;
  void *this_00;
  const_reference pvVar3;
  const_reference pvVar4;
  size_type sVar5;
  const_reference pvVar6;
  reference pvVar7;
  const_reference ppAVar8;
  double dVar9;
  int local_ec;
  int local_e8;
  int s_3;
  int a_2;
  int o;
  int s_2;
  int a_1;
  State *next;
  double dStack_c8;
  int i;
  double sum;
  int a;
  int s_1;
  int goal;
  int g;
  int s;
  allocator<char> local_81;
  value_type local_80;
  allocator<char> local_49;
  value_type local_48;
  undefined1 local_28 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  actions;
  Adventurer *this_local;
  
  actions.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"stay",&local_49);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_28,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator(&local_49);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,"left",&local_81);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_28,&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  std::allocator<char>::~allocator(&local_81);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&s,"right",(allocator<char> *)((long)&g + 3));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_28,(value_type *)&s);
  std::__cxx11::string::~string((string *)&s);
  std::allocator<char>::~allocator((allocator<char> *)((long)&g + 3));
  poVar2 = std::operator<<((ostream *)&std::cout,"<?xml version=\'1.0\' encoding=\'ISO-8859-1\'?>");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<(poVar2,
                           "<pomdpx version=\'1.0\' id=\'tagxmlfac\' xmlns:xsi=\'http://www.w3.org/2001/XMLSchema-instance\' xsi:noNamespaceSchemaLocation=\'pomdpx.xsd\'>"
                          );
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<(poVar2,"<Description>");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<(poVar2,"description");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<(poVar2,"</Description>");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<(poVar2,"<Discount>0.95</Discount>");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,"<Variable>");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<(poVar2,
                           "<StateVar vnamePrev=\"state_0\" vnameCurr=\"state_1\" fullyObs=\"false\"> <ValueEnum>"
                          );
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  goal = 0;
  while( true ) {
    iVar1 = (**(code **)(*(long *)this + 0xf8))();
    if (iVar1 <= goal) break;
    poVar2 = std::operator<<((ostream *)&std::cout," s");
    std::ostream::operator<<(poVar2,goal);
    goal = goal + 1;
  }
  poVar2 = std::operator<<((ostream *)&std::cout," st </ValueEnum> </StateVar>");
  this_00 = (void *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = (ostream *)std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<(poVar2,"<ObsVar vname=\"obs\"> <ValueEnum>");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  for (s_1 = 0; s_1 < this->num_goals_; s_1 = s_1 + 1) {
    poVar2 = std::operator<<((ostream *)&std::cout," o");
    std::ostream::operator<<(poVar2,s_1);
  }
  poVar2 = std::operator<<((ostream *)&std::cout," ot");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<(poVar2,"</ValueEnum>");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<(poVar2,"</ObsVar>");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<(poVar2,
                           "<ActionVar vname=\"action\"> <ValueEnum> stay left right </ValueEnum> </ActionVar>"
                          );
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<(poVar2,"<RewardVar vname=\"reward\"/> </Variable>");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,
                           "<InitialStateBelief> <CondProb> <Var> state_0 </Var> <Parent> null </Parent>"
                          );
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<(poVar2,"<Parameter type = \"TBL\">");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  for (a = 0; a < this->num_goals_; a = a + 1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"<Entry> <Instance> s");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,a * this->size_);
    poVar2 = std::operator<<(poVar2," </Instance> <ProbTable> ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,1.0 / (double)this->num_goals_);
    poVar2 = std::operator<<(poVar2," </ProbTable> </Entry>");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  poVar2 = std::operator<<((ostream *)&std::cout,"</Parameter> </CondProb> </InitialStateBelief>");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,
                           "<StateTransitionFunction> <CondProb> <Var> state_1 </Var> <Parent>action state_0</Parent>"
                          );
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<(poVar2,"<Parameter type = \"TBL\">");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  sum._4_4_ = 0;
  while( true ) {
    iVar1 = (**(code **)(*(long *)this + 0xf8))();
    if (iVar1 <= sum._4_4_) break;
    sum._0_4_ = 0;
    while( true ) {
      iVar1 = (**(code **)(*(long *)this + 0x28))();
      if (iVar1 <= sum._0_4_) break;
      dStack_c8 = 0.0;
      next._4_4_ = 0;
      while( true ) {
        pvVar3 = std::
                 vector<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>,_std::allocator<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>_>_>
                 ::operator[](&this->transition_probabilities_,(long)sum._4_4_);
        pvVar4 = std::
                 vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>
                 ::operator[](pvVar3,(long)sum._0_4_);
        sVar5 = std::vector<despot::State,_std::allocator<despot::State>_>::size(pvVar4);
        if (sVar5 <= (ulong)(long)next._4_4_) break;
        pvVar3 = std::
                 vector<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>,_std::allocator<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>_>_>
                 ::operator[](&this->transition_probabilities_,(long)sum._4_4_);
        pvVar4 = std::
                 vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>
                 ::operator[](pvVar3,(long)sum._0_4_);
        pvVar6 = std::vector<despot::State,_std::allocator<despot::State>_>::operator[]
                           (pvVar4,(long)next._4_4_);
        poVar2 = std::operator<<((ostream *)&std::cout,"<Entry> <Instance> ");
        pvVar7 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)local_28,(long)sum._0_4_);
        poVar2 = std::operator<<(poVar2,(string *)pvVar7);
        poVar2 = std::operator<<(poVar2," s");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,sum._4_4_);
        poVar2 = std::operator<<(poVar2," s");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,*(int *)(pvVar6 + 0xc));
        poVar2 = std::operator<<(poVar2," </Instance> <ProbTable> ");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,*(double *)(pvVar6 + 0x18));
        poVar2 = std::operator<<(poVar2," </ProbTable> </Entry>");
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
        dStack_c8 = *(double *)(pvVar6 + 0x18) + dStack_c8;
        next._4_4_ = next._4_4_ + 1;
      }
      if (1e-06 < ABS(dStack_c8 - 1.0)) {
        poVar2 = std::operator<<((ostream *)&std::cout,"<Entry> <Instance> ");
        pvVar7 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)local_28,(long)sum._0_4_);
        poVar2 = std::operator<<(poVar2,(string *)pvVar7);
        poVar2 = std::operator<<(poVar2," s");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,sum._4_4_);
        poVar2 = std::operator<<(poVar2," st </Instance> <ProbTable> ");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,1.0 - dStack_c8);
        poVar2 = std::operator<<(poVar2," </ProbTable> </Entry>");
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      }
      sum._0_4_ = sum._0_4_ + 1;
    }
    sum._4_4_ = sum._4_4_ + 1;
  }
  poVar2 = std::operator<<((ostream *)&std::cout,
                           "<Entry> <Instance> * st st </Instance> <ProbTable> 1.0 </ProbTable> </Entry>"
                          );
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,
                           "</Parameter> </CondProb> </StateTransitionFunction>");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,
                           "<ObsFunction> <CondProb> <Var> obs </Var> <Parent>action state_1</Parent>"
                          );
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<(poVar2,"<Parameter type = \"TBL\">");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  o = 0;
  while( true ) {
    iVar1 = (**(code **)(*(long *)this + 0x28))();
    if (iVar1 <= o) break;
    a_2 = 0;
    while( true ) {
      iVar1 = (**(code **)(*(long *)this + 0xf8))();
      if (iVar1 <= a_2) break;
      for (s_3 = 0; s_3 < this->num_goals_; s_3 = s_3 + 1) {
        poVar2 = std::operator<<((ostream *)&std::cout,"<Entry> <Instance> ");
        pvVar7 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)local_28,(long)o);
        poVar2 = std::operator<<(poVar2,(string *)pvVar7);
        poVar2 = std::operator<<(poVar2," s");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,a_2);
        poVar2 = std::operator<<(poVar2," o");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,s_3);
        poVar2 = std::operator<<(poVar2," </Instance> <ProbTable> ");
        ppAVar8 = std::vector<despot::AdventurerState_*,_std::allocator<despot::AdventurerState_*>_>
                  ::operator[](&this->states_,(long)a_2);
        dVar9 = (double)(**(code **)(*(long *)this + 0x38))(this,(long)s_3,*ppAVar8,o);
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,dVar9);
        poVar2 = std::operator<<(poVar2," </ProbTable> </Entry>");
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      }
      a_2 = a_2 + 1;
    }
    o = o + 1;
  }
  poVar2 = std::operator<<((ostream *)&std::cout,
                           "<Entry> <Instance> * st ot </Instance> <ProbTable> 1.0 </ProbTable> </Entry>"
                          );
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,"</Parameter> </CondProb> </ObsFunction>");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,
                           "<RewardFunction> <Func> <Var> reward </Var> <Parent>action state_0</Parent>"
                          );
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<(poVar2,"<Parameter type = \"TBL\">");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  local_e8 = 0;
  while( true ) {
    iVar1 = (**(code **)(*(long *)this + 0x28))();
    if (iVar1 <= local_e8) break;
    local_ec = 0;
    while( true ) {
      iVar1 = (**(code **)(*(long *)this + 0xf8))();
      if (iVar1 <= local_ec) break;
      poVar2 = std::operator<<((ostream *)&std::cout,"<Entry> <Instance> ");
      pvVar7 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_28,(long)local_e8);
      poVar2 = std::operator<<(poVar2,(string *)pvVar7);
      poVar2 = std::operator<<(poVar2," s");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_ec);
      poVar2 = std::operator<<(poVar2," </Instance> <ValueTable> ");
      dVar9 = (double)(**(code **)(*(long *)this + 0x118))(this,local_ec,local_e8);
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,dVar9);
      poVar2 = std::operator<<(poVar2," </ValueTable> </Entry>");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      local_ec = local_ec + 1;
    }
    local_e8 = local_e8 + 1;
  }
  poVar2 = std::operator<<((ostream *)&std::cout,
                           "<Entry> <Instance> * st </Instance> <ValueTable> 0 </ValueTable> </Entry>"
                          );
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,"</Parameter> </Func> </RewardFunction>");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,"</pomdpx>");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_28);
  return;
}

Assistant:

void Adventurer::PrintPOMDPX() const {
	vector<string> actions;
	actions.push_back("stay");
	actions.push_back("left");
	actions.push_back("right");

	cout << "<?xml version='1.0' encoding='ISO-8859-1'?>" << endl
		<< "<pomdpx version='1.0' id='tagxmlfac' xmlns:xsi='http://www.w3.org/2001/XMLSchema-instance' xsi:noNamespaceSchemaLocation='pomdpx.xsd'>"
		<< endl << "<Description>" << endl << "description" << endl
		<< "</Description>" << endl << "<Discount>0.95</Discount>" << endl;

	cout << "<Variable>" << endl
		<< "<StateVar vnamePrev=\"state_0\" vnameCurr=\"state_1\" fullyObs=\"false\"> <ValueEnum>"
		<< endl;
	for (int s = 0; s < NumStates(); s++)
		cout << " s" << s;
	cout << " st </ValueEnum> </StateVar>" << endl << endl
		<< "<ObsVar vname=\"obs\"> <ValueEnum>" << endl;
	for (int g = 0; g < num_goals_; g++)
		cout << " o" << g;
	cout << " ot" << endl << "</ValueEnum>" << endl << "</ObsVar>" << endl
		<< "<ActionVar vname=\"action\"> <ValueEnum> stay left right </ValueEnum> </ActionVar>"
		<< endl << "<RewardVar vname=\"reward\"/> </Variable>" << endl;

	cout
		<< "<InitialStateBelief> <CondProb> <Var> state_0 </Var> <Parent> null </Parent>"
		<< endl << "<Parameter type = \"TBL\">" << endl;
	for (int goal = 0; goal < num_goals_; goal++) {
		cout << "<Entry> <Instance> s" << goal * size_
			<< " </Instance> <ProbTable> " << 1.0 / num_goals_
			<< " </ProbTable> </Entry>" << endl;
	}
	cout << "</Parameter> </CondProb> </InitialStateBelief>" << endl;

	cout
		<< "<StateTransitionFunction> <CondProb> <Var> state_1 </Var> <Parent>action state_0</Parent>"
		<< endl << "<Parameter type = \"TBL\">" << endl;
	for (int s = 0; s < NumStates(); s++) {
		for (int a = 0; a < NumActions(); a++) {
			double sum = 0;
			for (int i = 0; i < transition_probabilities_[s][a].size(); i++) {
				const State& next = transition_probabilities_[s][a][i];
				cout << "<Entry> <Instance> " << actions[a] << " s" << s << " s"
					<< next.state_id << " </Instance> <ProbTable> "
					<< next.weight << " </ProbTable> </Entry>" << endl;
				sum += next.weight;
			}

			if (fabs(sum - 1.0) > 0.000001)
				cout << "<Entry> <Instance> " << actions[a] << " s" << s
					<< " st </Instance> <ProbTable> " << (1 - sum)
					<< " </ProbTable> </Entry>" << endl;
		}
	}
	cout
		<< "<Entry> <Instance> * st st </Instance> <ProbTable> 1.0 </ProbTable> </Entry>"
		<< endl;
	cout << "</Parameter> </CondProb> </StateTransitionFunction>" << endl;

	cout
		<< "<ObsFunction> <CondProb> <Var> obs </Var> <Parent>action state_1</Parent>"
		<< endl << "<Parameter type = \"TBL\">" << endl;
	for (int a = 0; a < NumActions(); a++) {
		for (int s = 0; s < NumStates(); s++) {
			for (int o = 0; o < num_goals_; o++) {
				cout << "<Entry> <Instance> " << actions[a] << " s" << s << " o"
					<< o << " </Instance> <ProbTable> "
					<< ObsProb(o, *(states_[s]), a) << " </ProbTable> </Entry>"
					<< endl;
			}
		}
	}
	cout
		<< "<Entry> <Instance> * st ot </Instance> <ProbTable> 1.0 </ProbTable> </Entry>"
		<< endl;
	cout << "</Parameter> </CondProb> </ObsFunction>" << endl;

	cout
		<< "<RewardFunction> <Func> <Var> reward </Var> <Parent>action state_0</Parent>"
		<< endl << "<Parameter type = \"TBL\">" << endl;
	for (int a = 0; a < NumActions(); a++) {
		for (int s = 0; s < NumStates(); s++) {
			cout << "<Entry> <Instance> " << actions[a] << " s" << s
				<< " </Instance> <ValueTable> " << Reward(s, a)
				<< " </ValueTable> </Entry>" << endl;
		}
	}
	cout
		<< "<Entry> <Instance> * st </Instance> <ValueTable> 0 </ValueTable> </Entry>"
		<< endl;
	cout << "</Parameter> </Func> </RewardFunction>" << endl;
	cout << "</pomdpx>" << endl;
}